

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall icu_63::MessagePattern::~MessagePattern(MessagePattern *this)

{
  UMemory *pUVar1;
  void *in_RSI;
  MessagePattern *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_004f2a30;
  pUVar1 = (UMemory *)this->partsList;
  if (pUVar1 != (UMemory *)0x0) {
    MessagePatternPartsList::~MessagePatternPartsList((MessagePatternPartsList *)pUVar1);
    UMemory::operator_delete(pUVar1,in_RSI);
  }
  pUVar1 = (UMemory *)this->numericValuesList;
  if (pUVar1 != (UMemory *)0x0) {
    MessagePatternDoubleList::~MessagePatternDoubleList((MessagePatternDoubleList *)pUVar1);
    UMemory::operator_delete(pUVar1,in_RSI);
  }
  UnicodeString::~UnicodeString(&this->msg);
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

MessagePattern::~MessagePattern() {
    delete partsList;
    delete numericValuesList;
}